

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_reporter_tests.c
# Opt level: O2

void XmlReporter__will_report_a_failing_test(void)

{
  Constraint *pCVar1;
  char *actual;
  char *pcVar2;
  va_list null_arguments;
  
  null_arguments[0].gp_offset = 0;
  null_arguments[0].fp_offset = 0;
  null_arguments[0].overflow_arg_area = (void *)0x0;
  null_arguments[0].reg_save_area = (void *)0x0;
  (*reporter->start_test)(reporter,"test_name");
  (*reporter->show_fail)(reporter,"file",2,"test_name",null_arguments);
  (*reporter->finish_test)(reporter,"filename",0x29a,(char *)0x0);
  pcVar2 = output;
  pCVar1 = (Constraint *)
           create_contains_string_constraint
                     ("<failure message=\"test_name\">","\"<failure message=\\\"test_name\\\">\"");
  cgreen::assert_that_<char*>
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/xml_reporter_tests.c"
             ,0x7d,"output",pcVar2,pCVar1);
  pcVar2 = output;
  pCVar1 = (Constraint *)
           create_contains_string_constraint
                     ("<location file=\"file\" line=\"2\"/>",
                      "\"<location file=\\\"file\\\" line=\\\"2\\\"/>\"");
  cgreen::assert_that_<char*>
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/xml_reporter_tests.c"
             ,0x7e,"output",pcVar2,pCVar1);
  pcVar2 = output;
  actual = strstr(output,"time=");
  pcVar2 = strstr(pcVar2,"<failure");
  pCVar1 = (Constraint *)create_less_than_value_constraint(pcVar2,"strstr(output, \"<failure\")");
  cgreen::assert_that_<char*>
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/xml_reporter_tests.c"
             ,0x7f,"strstr(output, \"time=\")",actual,pCVar1);
  return;
}

Assistant:

static void setup_xml_reporter_tests(void) {
    reporter = create_xml_reporter("PREFIX");

    // We can not use setup_reporting() since we are running
    // inside a test suite which needs the real reporting
    // So we'll have to set up the messaging explicitly
    reporter->ipc = start_cgreen_messaging(667);

    clear_output();
    set_xml_reporter_printer(reporter, mocked_printf);
}